

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_WriteWhileExplicitRenegotiate_Test::TestBody
          (SSLTest_WriteWhileExplicitRenegotiate_Test *this)

{
  undefined1 auVar1 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dVar2;
  bool bVar3;
  int iVar4;
  SSL_METHOD *method;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar7;
  char *in_R9;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  UniquePtr<SSL> client;
  uint8_t byte;
  int ret;
  UniquePtr<SSL> server;
  uint8_t buf [5];
  UniquePtr<SSL_CTX> ctx;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  Bytes local_90;
  undefined1 local_80 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Head_base<0UL,_ssl_st_*,_false> local_60;
  undefined1 local_51;
  AssertHelper local_50;
  _Head_base<0UL,_ssl_st_*,_false> local_48;
  undefined1 local_3d [5];
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Stack_38;
  
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&_Stack_38,method);
  local_a0[0] = (internal)(_Stack_38._M_head_impl != (SSL_CTX *)0x0);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (_Stack_38._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_a0,(AssertionResult *)0x336329,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x2145,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_90);
  }
  else {
    iVar4 = SSL_CTX_set_min_proto_version(_Stack_38._M_head_impl,0x303);
    local_a0[0] = (internal)(iVar4 != 0);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)local_a0,
                 (AssertionResult *)"SSL_CTX_set_min_proto_version(ctx.get(), 0x0303)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x2147,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_90);
    }
    else {
      iVar4 = SSL_CTX_set_max_proto_version(_Stack_38._M_head_impl,0x303);
      local_a0[0] = (internal)(iVar4 != 0);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)local_a0,
                   (AssertionResult *)"SSL_CTX_set_max_proto_version(ctx.get(), 0x0303)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2148,(char *)CONCAT71(local_80._1_7_,local_80[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_90);
      }
      else {
        iVar4 = SSL_CTX_set_strict_cipher_list
                          (_Stack_38._M_head_impl,"TLS_ECDHE_RSA_WITH_CHACHA20_POLY1305_SHA256");
        local_a0[0] = (internal)(iVar4 != 0);
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 != 0) {
          local_60._M_head_impl = (ssl_st *)0x0;
          local_48._M_head_impl = (ssl_st *)0x0;
          bVar3 = CreateClientAndServer
                            ((UniquePtr<SSL> *)&local_60,(UniquePtr<SSL> *)&local_48,
                             _Stack_38._M_head_impl,_Stack_38._M_head_impl);
          local_a0[0] = (internal)bVar3;
          local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar3) {
            SSL_set_renegotiate_mode(local_60._M_head_impl,ssl_renegotiate_explicit);
            bVar3 = CompleteHandshakes(local_60._M_head_impl,local_48._M_head_impl);
            local_a0[0] = (internal)bVar3;
            local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&local_90);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_80,(internal *)local_a0,
                         (AssertionResult *)"CompleteHandshakes(client.get(), server.get())","false"
                         ,"true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x214f,(char *)CONCAT71(local_80._1_7_,local_80[0]));
              testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
              goto LAB_001cb596;
            }
            lVar6 = 0;
            do {
              local_50.data_._0_4_ = SSL_write((SSL *)local_60._M_head_impl,"hello",5);
              if ((int)local_50.data_ == 5) {
                lVar6 = lVar6 + 1;
                iVar4 = 0;
              }
              else {
                local_a0._0_4_ = 0xffffffff;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"-1","ret",(int *)local_a0,(int *)&local_50);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2158,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 3;
                iVar4 = SSL_get_error((SSL *)local_60._M_head_impl,(int)local_50.data_);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"3","SSL_get_error(client.get(), ret)",
                           (int *)local_a0,(int *)&local_90);
                iVar4 = 2;
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  pcVar7 = "";
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) != (undefined8 *)0x0) {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2159,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
                  if (local_a0 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_a0 + 8))();
                  }
                  iVar4 = 1;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
              }
            } while (iVar4 == 0);
            if (iVar4 == 2) {
              bVar3 = testing::internal::AlwaysTrue();
              if (!bVar3) {
LAB_001cb28e:
                testing::Message::Message((Message *)local_80);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x215f,
                           "Expected: WriteHelloRequest(server.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                          );
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_a0,(Message *)local_80);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
                if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
                }
                goto LAB_001cb5dd;
              }
              testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                        ((HasNewFatalFailureHelper *)local_80);
              bVar3 = testing::internal::AlwaysTrue();
              if (bVar3) {
                WriteHelloRequest(local_48._M_head_impl);
              }
              dVar2 = local_78[0];
              testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                        ((HasNewFatalFailureHelper *)local_80);
              if (dVar2 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )0x0) goto LAB_001cb28e;
              local_a0._0_4_ = 0xffffffff;
              iVar4 = SSL_read((SSL *)local_60._M_head_impl,&local_51,1);
              local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_80,"-1","SSL_read(client.get(), &byte, 1)",
                         (int *)local_a0,(int *)&local_90);
              if (local_80[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_a0);
                if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_90,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x2163,pcVar7);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_90,(Message *)local_a0);
LAB_001cb96d:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
                if (local_a0 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_a0 + 8))();
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                goto LAB_001cb5dd;
                this_00 = local_78;
                __ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT71(local_78._1_7_,local_78[0]);
              }
              else {
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 0x13;
                iVar4 = SSL_get_error((SSL *)local_60._M_head_impl,-1);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"19","SSL_get_error(client.get(), -1)",
                           (int *)local_a0,(int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2164,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                if (lVar6 != 0) {
                  do {
                    local_a0._0_4_ = 5;
                    iVar4 = SSL_read((SSL *)local_48._M_head_impl,local_3d,5);
                    local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_80,"int(sizeof(buf))",
                               "SSL_read(server.get(), buf, sizeof(buf))",(int *)local_a0,
                               (int *)&local_90);
                    if (local_80[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_a0);
                      if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                        pcVar7 = "";
                      }
                      else {
                        pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_90,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x2169,pcVar7);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_90,(Message *)local_a0);
                      goto LAB_001cb96d;
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT71(local_78._1_7_,local_78[0]) !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT71(local_78._1_7_,local_78[0]));
                    }
                    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &DAT_00000005;
                    local_90.span_.data_ = "hello";
                    local_90.span_.size_ = 5;
                    local_a0 = (undefined1  [8])local_3d;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)local_80,"Bytes(buf)","Bytes(kInput)",(Bytes *)local_a0,
                               &local_90);
                    if (local_80[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_a0);
                      pcVar7 = "";
                      if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) != (undefined8 *)0x0) {
                        pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_90,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x216a,pcVar7);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_90,(Message *)local_a0);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
                      if (local_a0 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_a0 + 8))();
                      }
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT71(local_78._1_7_,local_78[0]) !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT71(local_78._1_7_,local_78[0]));
                    }
                    lVar6 = lVar6 + -1;
                  } while (lVar6 != 0);
                }
                local_a0._0_4_ = 5;
                iVar4 = SSL_write((SSL *)local_60._M_head_impl,"hello",5);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"int(sizeof(kInput))",
                           "SSL_write(client.get(), kInput, sizeof(kInput))",(int *)local_a0,
                           (int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2170,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 5;
                iVar4 = SSL_read((SSL *)local_48._M_head_impl,local_3d,5);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"int(sizeof(buf))",
                           "SSL_read(server.get(), buf, sizeof(buf))",(int *)local_a0,
                           (int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2171,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &DAT_00000005;
                local_90.span_.data_ = "hello";
                local_90.span_.size_ = 5;
                local_a0 = (undefined1  [8])local_3d;
                testing::internal::CmpHelperEQ<Bytes,Bytes>
                          ((internal *)local_80,"Bytes(buf)","Bytes(kInput)",(Bytes *)local_a0,
                           &local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2172,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
                  if (local_a0 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_a0 + 8))();
                  }
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 5;
                iVar4 = SSL_write((SSL *)local_60._M_head_impl,"hello",5);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"int(sizeof(kInput))",
                           "SSL_write(client.get(), kInput, sizeof(kInput))",(int *)local_a0,
                           (int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2175,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 5;
                iVar4 = SSL_read((SSL *)local_48._M_head_impl,local_3d,5);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"int(sizeof(buf))",
                           "SSL_read(server.get(), buf, sizeof(buf))",(int *)local_a0,
                           (int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2176,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &DAT_00000005;
                local_90.span_.data_ = "hello";
                local_90.span_.size_ = 5;
                local_a0 = (undefined1  [8])local_3d;
                testing::internal::CmpHelperEQ<Bytes,Bytes>
                          ((internal *)local_80,"Bytes(buf)","Bytes(kInput)",(Bytes *)local_a0,
                           &local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2177,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
                  if (local_a0 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_a0 + 8))();
                  }
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 0xffffffff;
                iVar4 = SSL_read((SSL *)local_60._M_head_impl,&local_51,1);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"-1","SSL_read(client.get(), &byte, 1)",
                           (int *)local_a0,(int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x217a,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 0x13;
                iVar4 = SSL_get_error((SSL *)local_60._M_head_impl,-1);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"19","SSL_get_error(client.get(), -1)",
                           (int *)local_a0,(int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x217b,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                iVar4 = SSL_renegotiate((SSL *)local_60._M_head_impl);
                auVar1 = local_a0;
                local_a0[0] = (internal)(iVar4 != 0);
                local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar4 == 0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_80,(internal *)local_a0,
                             (AssertionResult *)"SSL_renegotiate(client.get())","false","true",in_R9
                            );
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x217d,(char *)CONCAT71(local_80._1_7_,local_80[0]));
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
                  goto LAB_001cb596;
                }
                local_a0._4_4_ = auVar1._4_4_;
                local_a0._0_4_ = 0xffffffff;
                iVar4 = SSL_read((SSL *)local_60._M_head_impl,&local_51,1);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"-1","SSL_read(client.get(), &byte, 1)",
                           (int *)local_a0,(int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x217e,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 2;
                iVar4 = SSL_get_error((SSL *)local_60._M_head_impl,-1);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"2","SSL_get_error(client.get(), -1)",
                           (int *)local_a0,(int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x217f,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 0xffffffff;
                iVar4 = SSL_read((SSL *)local_48._M_head_impl,local_3d,5);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"-1","SSL_read(server.get(), buf, sizeof(buf))",
                           (int *)local_a0,(int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2182,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                local_a0._0_4_ = 1;
                iVar4 = SSL_get_error((SSL *)local_48._M_head_impl,-1);
                local_90.span_.data_ = (uchar *)CONCAT44(local_90.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_80,"1","SSL_get_error(server.get(), -1)",
                           (int *)local_a0,(int *)&local_90);
                if (local_80[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_a0);
                  if ((undefined8 *)CONCAT71(local_78._1_7_,local_78[0]) == (undefined8 *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = *(char **)CONCAT71(local_78._1_7_,local_78[0]);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2183,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_90,(Message *)local_a0);
                  goto LAB_001cb96d;
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_78._1_7_,local_78[0]) !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT71(local_78._1_7_,local_78[0]));
                }
                uVar5 = ERR_get_error();
                ErrorEquals((uint32_t)local_a0,(int)uVar5,0x10);
                if (local_a0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_80,(internal *)local_a0,
                             (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_SSL, 182)",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2185,(char *)CONCAT71(local_80._1_7_,local_80[0]));
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
                  testing::internal::AssertHelper::~AssertHelper(&local_50);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_80._1_7_,local_80[0]),
                                    (ulong)(local_70._M_allocated_capacity + 1));
                  }
                  if ((long *)local_90.span_.data_ != (long *)0x0) {
                    (**(code **)(*(long *)local_90.span_.data_ + 8))();
                  }
                }
                if (local_98 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                goto LAB_001cb5dd;
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_98;
                __ptr = local_98;
              }
              goto LAB_001cb5d8;
            }
          }
          else {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_80,(internal *)local_a0,
                       (AssertionResult *)
                       "CreateClientAndServer(&client, &server, ctx.get(), ctx.get())","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x214d,(char *)CONCAT71(local_80._1_7_,local_80[0]));
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
LAB_001cb596:
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_98;
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_80._1_7_,local_80[0]),
                              (ulong)(local_70._M_allocated_capacity + 1));
            }
            if ((long *)local_90.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_90.span_.data_ + 8))();
            }
            __ptr = local_98;
            if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
LAB_001cb5d8:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(this_00,__ptr);
            }
          }
LAB_001cb5dd:
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_48);
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_60);
          goto LAB_001cb5f1;
        }
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)local_a0,
                   (AssertionResult *)
                   "SSL_CTX_set_strict_cipher_list( ctx.get(), \"TLS_ECDHE_RSA_WITH_CHACHA20_POLY1305_SHA256\")"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x214a,(char *)CONCAT71(local_80._1_7_,local_80[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_90);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_80._1_7_,local_80[0]),
                    (ulong)(local_70._M_allocated_capacity + 1));
  }
  if ((long *)local_90.span_.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_90.span_.data_ + 8))();
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
LAB_001cb5f1:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&_Stack_38);
  return;
}

Assistant:

TEST(SSLTest, WriteWhileExplicitRenegotiate) {
  bssl::UniquePtr<SSL_CTX> ctx(CreateContextWithTestCertificate(TLS_method()));
  ASSERT_TRUE(ctx);

  ASSERT_TRUE(SSL_CTX_set_min_proto_version(ctx.get(), TLS1_2_VERSION));
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(ctx.get(), TLS1_2_VERSION));
  ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(
      ctx.get(), "TLS_ECDHE_RSA_WITH_CHACHA20_POLY1305_SHA256"));

  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, ctx.get(), ctx.get()));
  SSL_set_renegotiate_mode(client.get(), ssl_renegotiate_explicit);
  ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));

  static const uint8_t kInput[] = {'h', 'e', 'l', 'l', 'o'};

  // Write "hello" until the buffer is full, so |client| has a pending write.
  size_t num_writes = 0;
  for (;;) {
    int ret = SSL_write(client.get(), kInput, sizeof(kInput));
    if (ret != int(sizeof(kInput))) {
      ASSERT_EQ(-1, ret);
      ASSERT_EQ(SSL_ERROR_WANT_WRITE, SSL_get_error(client.get(), ret));
      break;
    }
    num_writes++;
  }

  ASSERT_NO_FATAL_FAILURE(WriteHelloRequest(server.get()));

  // |SSL_read| should pick up the HelloRequest.
  uint8_t byte;
  ASSERT_EQ(-1, SSL_read(client.get(), &byte, 1));
  ASSERT_EQ(SSL_ERROR_WANT_RENEGOTIATE, SSL_get_error(client.get(), -1));

  // Drain the data from the |client|.
  uint8_t buf[sizeof(kInput)];
  for (size_t i = 0; i < num_writes; i++) {
    ASSERT_EQ(int(sizeof(buf)), SSL_read(server.get(), buf, sizeof(buf)));
    EXPECT_EQ(Bytes(buf), Bytes(kInput));
  }

  // |client| should be able to finish the pending write and continue to write,
  // despite the paused HelloRequest.
  ASSERT_EQ(int(sizeof(kInput)),
            SSL_write(client.get(), kInput, sizeof(kInput)));
  ASSERT_EQ(int(sizeof(buf)), SSL_read(server.get(), buf, sizeof(buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kInput));

  ASSERT_EQ(int(sizeof(kInput)),
            SSL_write(client.get(), kInput, sizeof(kInput)));
  ASSERT_EQ(int(sizeof(buf)), SSL_read(server.get(), buf, sizeof(buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kInput));

  // |SSL_read| is stuck until we acknowledge the HelloRequest.
  ASSERT_EQ(-1, SSL_read(client.get(), &byte, 1));
  ASSERT_EQ(SSL_ERROR_WANT_RENEGOTIATE, SSL_get_error(client.get(), -1));

  ASSERT_TRUE(SSL_renegotiate(client.get()));
  ASSERT_EQ(-1, SSL_read(client.get(), &byte, 1));
  ASSERT_EQ(SSL_ERROR_WANT_READ, SSL_get_error(client.get(), -1));

  // We never renegotiate as a server.
  ASSERT_EQ(-1, SSL_read(server.get(), buf, sizeof(buf)));
  ASSERT_EQ(SSL_ERROR_SSL, SSL_get_error(server.get(), -1));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_SSL, SSL_R_NO_RENEGOTIATION));
}